

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::PrintTestPartResultToString_abi_cxx11_(TestPartResult *test_part_result)

{
  Type type;
  Message *this;
  Message *this_00;
  TestPartResult *in_RSI;
  string *in_RDI;
  int in_stack_00000024;
  char *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  TestPartResult *in_stack_ffffffffffffff70;
  Message *in_stack_ffffffffffffffa0;
  string local_38 [40];
  TestPartResult *local_10;
  
  local_10 = in_RSI;
  Message::Message(in_stack_ffffffffffffffa0);
  TestPartResult::file_name(in_stack_ffffffffffffff70);
  TestPartResult::line_number(local_10);
  FormatFileLocation_abi_cxx11_(in_stack_00000028,in_stack_00000024);
  Message::operator<<((Message *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Message::operator<<((Message *)in_stack_ffffffffffffff70,(char (*) [2])in_stack_ffffffffffffff68);
  type = TestPartResult::type(local_10);
  this = (Message *)TestPartResultTypeToString(type);
  this_00 = Message::operator<<((Message *)in_stack_ffffffffffffff70,
                                (char **)in_stack_ffffffffffffff68);
  TestPartResult::message((TestPartResult *)0x15ad9c);
  Message::operator<<(this_00,(char **)in_stack_ffffffffffffff68);
  Message::GetString_abi_cxx11_(this);
  std::__cxx11::string::~string(local_38);
  Message::~Message((Message *)0x15addd);
  return in_RDI;
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message() << internal::FormatFileLocation(
                           test_part_result.file_name(),
                           test_part_result.line_number())
                    << " "
                    << TestPartResultTypeToString(test_part_result.type())
                    << test_part_result.message())
      .GetString();
}